

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O0

VARTYPE __thiscall Node::ScanType(Node *this)

{
  int iVar1;
  Node *this_local;
  
  iVar1 = this->Type;
  if (iVar1 == 0x110) {
    this_local._4_4_ = VARTYPE_BYTE;
  }
  else if (iVar1 == 0x123) {
    this_local._4_4_ = VARTYPE_DECIMAL;
  }
  else if (iVar1 == 300) {
    this_local._4_4_ = VARTYPE_DOUBLE;
  }
  else if (iVar1 == 0x149) {
    this_local._4_4_ = VARTYPE_DOUBLE;
  }
  else if (iVar1 == 0x14f) {
    this_local._4_4_ = VARTYPE_DOUBLE;
  }
  else if (iVar1 == 0x157) {
    this_local._4_4_ = VARTYPE_INTEGER;
  }
  else if (iVar1 == 0x15f) {
    this_local._4_4_ = VARTYPE_LONG;
  }
  else if (iVar1 == 0x182) {
    this_local._4_4_ = RealType;
  }
  else if (iVar1 == 0x191) {
    this_local._4_4_ = VARTYPE_RFA;
  }
  else if (iVar1 == 0x1a0) {
    this_local._4_4_ = VARTYPE_DYNSTR;
  }
  else if (iVar1 == 0x1ba) {
    this_local._4_4_ = VARTYPE_WORD;
  }
  else {
    this_local._4_4_ = VARTYPE_NONE;
  }
  return this_local._4_4_;
}

Assistant:

VARTYPE Node::ScanType(void)
{
	//
	// Try to figure out the variable type
	//
	switch (Type)
	{
	case BAS_S_REAL:
		return(RealType);

	case BAS_S_DOUBLE:
		return(VARTYPE_DOUBLE);

	case BAS_S_BYTE:
		return(VARTYPE_BYTE);

	case BAS_S_GFLOAT:
		return(VARTYPE_DOUBLE);

	case BAS_S_HFLOAT:
		return(VARTYPE_DOUBLE);

	case BAS_S_INTEGER:
		return(VARTYPE_INTEGER);

	case BAS_S_LONG:
		return(VARTYPE_LONG);

	case BAS_S_RFA:
		return(VARTYPE_RFA);

	case BAS_S_STRING:
		return(VARTYPE_DYNSTR);

	case BAS_S_WORD:
		return(VARTYPE_WORD);

	case BAS_S_DECIMAL:
		return(VARTYPE_DECIMAL);
	}

	return(VARTYPE_NONE);
}